

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestCaseTracking::ITracker::~ITracker(ITracker *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__ITracker_00251f60;
  NameAndLocation::~NameAndLocation((NameAndLocation *)0x136ca0);
  return;
}

Assistant:

ITracker::~ITracker() = default;